

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkillTree.cpp
# Opt level: O3

void __thiscall SkillTree::drawSelf(SkillTree *this,PixelGameEngine *pge,int64_t *internetPoints)

{
  PixelGameEngine *pPVar1;
  int64_t *internetPoints_00;
  const_iterator cVar2;
  Decal *decal;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar3;
  _Hash_node_base *p_Var4;
  PixelGameEngine *__k;
  PixelGameEngine *this_00;
  char *pcVar5;
  vf2d vStack_68;
  vf2d vStack_60;
  _Hash_node_base *p_Stack_58;
  PixelGameEngine *pPStack_50;
  int64_t *local_48;
  vi2d local_40;
  vi2d local_38;
  
  p_Var4 = (this->nodes)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    local_48 = internetPoints;
    do {
      pPStack_50 = (PixelGameEngine *)0x11901e;
      SkillTreeNode::drawSelf((SkillTreeNode *)(p_Var4 + 5),pge);
      pPVar1 = (PixelGameEngine *)p_Var4[0x11]._M_nxt;
      for (__k = (PixelGameEngine *)p_Var4[0x10]._M_nxt; internetPoints_00 = local_48, __k != pPVar1
          ; __k = (PixelGameEngine *)((__k->sAppName).field_2._M_local_buf + 8)) {
        pPStack_50 = (PixelGameEngine *)0x119040;
        this_00 = __k;
        cVar2 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,(key_type *)__k);
        if (cVar2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
            ._M_cur == (__node_type *)0x0) {
          pcVar5 = "_Map_base::at";
          pPStack_50 = (PixelGameEngine *)SkillTreeNode::drawSelf;
          std::__throw_out_of_range("_Map_base::at");
          vStack_60.x = (float)*(undefined8 *)(pcVar5 + 0x70) * 16.0 + 80.0;
          vStack_60.y = (float)((ulong)*(undefined8 *)(pcVar5 + 0x70) >> 0x20) * 16.0 + 180.0;
          p_Stack_58 = p_Var4;
          pPStack_50 = pge;
          decal = olc::Renderable::operator_cast_to_Decal_((Renderable *)(pcVar5 + 0x40));
          vStack_68.x = 1.0;
          vStack_68.y = 1.0;
          olc::PixelGameEngine::DrawDecal(this_00,&vStack_60,decal,&vStack_68,(Pixel *)&olc::WHITE);
          return;
        }
        paVar3 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::RED;
        if (*(char *)((long)cVar2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                            ._M_cur + 0xa0) != '\0') {
          paVar3 = (anon_union_4_2_12391da5_for_Pixel_0 *)&olc::GREEN;
        }
        local_38.x = (int)((float)*(undefined8 *)
                                   ((long)cVar2.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                                          ._M_cur + 0x98) * 16.0 + 4.0 + 80.0);
        local_38.y = (int)((float)((ulong)*(undefined8 *)
                                           ((long)cVar2.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SkillTree::SkillTreeNode>,_true>
                                                  ._M_cur + 0x98) >> 0x20) * 16.0 + 4.0 + 180.0);
        local_40.x = (int)(SUB84(p_Var4[0x13]._M_nxt,0) * 16.0 + 4.0 + 80.0);
        local_40.y = (int)((float)((ulong)p_Var4[0x13]._M_nxt >> 0x20) * 16.0 + 4.0 + 180.0);
        pPStack_50 = (PixelGameEngine *)0x1190c4;
        olc::PixelGameEngine::DrawLine(pge,&local_38,&local_40,(Pixel)paVar3->field_1,0xffffffff);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
    for (p_Var4 = (this->nodes)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
        p_Var4 = p_Var4->_M_nxt) {
      pPStack_50 = (PixelGameEngine *)0x1190f5;
      SkillTreeNode::drawExplanation((SkillTreeNode *)(p_Var4 + 5),pge,internetPoints_00);
    }
  }
  return;
}

Assistant:

void SkillTree::drawSelf(olc::PixelGameEngine *pge, std::int64_t &internetPoints) const {
    for (auto &node : nodes) {
	node.second.drawSelf(pge);
	for (const auto &dependency : node.second.getDependecies()) {
	    const auto &depNode = nodes.at(dependency);
	    const auto posFrom = depNode.getPos() * 16 + olc::vi2d{4, 4};
	    const auto posTo = node.second.getPos() * 16 + olc::vi2d{4, 4};
	    const auto color = depNode.isCompleted() ? olc::GREEN : olc::RED;
	    pge->DrawLine(posFrom + olc::vf2d{80, 180}, posTo + olc::vf2d{80, 180}, color);
	}
    }
    for (auto &node : nodes) {
	node.second.drawExplanation(pge, internetPoints);
    }
}